

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::detail::TestCase::TestCase
          (TestCase *this,funcType test,char *file,uint line,TestSuite *test_suite,String *type,
          int template_id)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  anon_union_24_2_13149d16_for_String_3 local_48;
  
  (this->super_TestCaseData).m_file.field_0.buf[0] = '\0';
  (this->super_TestCaseData).m_file.field_0.buf[0x17] = '\x17';
  (this->m_type).field_0.buf[0] = '\0';
  (this->m_type).field_0.buf[0x17] = '\x17';
  (this->m_full_name).field_0.buf[0] = '\0';
  (this->m_full_name).field_0.buf[0x17] = '\x17';
  sVar4 = strlen(file);
  pcVar5 = String::allocate((String *)&local_48.data,(size_type)sVar4);
  memcpy(pcVar5,file,sVar4 & 0xffffffff);
  if (&local_48 == (anon_union_24_2_13149d16_for_String_3 *)this) {
    if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
      operator_delete__(local_48.data.ptr);
    }
  }
  else {
    if (((this->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') &&
       (pcVar5 = (this->super_TestCaseData).m_file.field_0.data.ptr, pcVar5 != (char *)0x0)) {
      operator_delete__(pcVar5);
    }
    *(ulong *)((long)&(this->super_TestCaseData).m_file.field_0 + 0x10) =
         CONCAT17(local_48.buf[0x17],local_48._16_7_);
    (this->super_TestCaseData).m_file.field_0.data.ptr = local_48.data.ptr;
    *(undefined8 *)((long)&(this->super_TestCaseData).m_file.field_0 + 8) = local_48._8_8_;
  }
  (this->super_TestCaseData).m_line = line;
  (this->super_TestCaseData).m_name = (char *)0x0;
  pcVar5 = test_suite->m_description;
  (this->super_TestCaseData).m_test_suite = test_suite->m_test_suite;
  (this->super_TestCaseData).m_description = pcVar5;
  bVar1 = test_suite->m_no_breaks;
  bVar2 = test_suite->m_no_output;
  bVar3 = test_suite->m_may_fail;
  (this->super_TestCaseData).m_skip = test_suite->m_skip;
  (this->super_TestCaseData).m_no_breaks = bVar1;
  (this->super_TestCaseData).m_no_output = bVar2;
  (this->super_TestCaseData).m_may_fail = bVar3;
  (this->super_TestCaseData).m_should_fail = test_suite->m_should_fail;
  (this->super_TestCaseData).m_expected_failures = test_suite->m_expected_failures;
  (this->super_TestCaseData).m_timeout = test_suite->m_timeout;
  this->m_test = test;
  String::operator=(&this->m_type,type);
  this->m_template_id = template_id;
  return;
}

Assistant:

TestCase::TestCase(funcType test, const char* file, unsigned line, const TestSuite& test_suite,
                       const String& type, int template_id) {
        m_file              = file;
        m_line              = line;
        m_name              = nullptr; // will be later overridden in operator*
        m_test_suite        = test_suite.m_test_suite;
        m_description       = test_suite.m_description;
        m_skip              = test_suite.m_skip;
        m_no_breaks         = test_suite.m_no_breaks;
        m_no_output         = test_suite.m_no_output;
        m_may_fail          = test_suite.m_may_fail;
        m_should_fail       = test_suite.m_should_fail;
        m_expected_failures = test_suite.m_expected_failures;
        m_timeout           = test_suite.m_timeout;

        m_test        = test;
        m_type        = type;
        m_template_id = template_id;
    }